

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtUnionFind.cpp
# Opt level: O3

void __thiscall cbtUnionFind::allocate(cbtUnionFind *this,int N)

{
  uint uVar1;
  cbtElement *ptr;
  int i;
  uint uVar2;
  cbtElement *pcVar3;
  long lVar4;
  ulong uVar5;
  
  uVar1 = (this->m_elements).m_size;
  if ((int)uVar1 < N) {
    if ((this->m_elements).m_capacity < N) {
      if (N == 0) {
        pcVar3 = (cbtElement *)0x0;
        uVar2 = uVar1;
      }
      else {
        pcVar3 = (cbtElement *)cbtAlignedAllocInternal((long)N * 8,0x10);
        uVar2 = (this->m_elements).m_size;
      }
      if (0 < (int)uVar2) {
        uVar5 = 0;
        do {
          pcVar3[uVar5] = (this->m_elements).m_data[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      ptr = (this->m_elements).m_data;
      if ((ptr != (cbtElement *)0x0) && ((this->m_elements).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(ptr);
      }
      (this->m_elements).m_ownsMemory = true;
      (this->m_elements).m_data = pcVar3;
      (this->m_elements).m_capacity = N;
    }
    lVar4 = (long)(int)uVar1;
    do {
      pcVar3 = (this->m_elements).m_data + lVar4;
      pcVar3->m_id = 0;
      pcVar3->m_sz = 0;
      lVar4 = lVar4 + 1;
    } while (N != lVar4);
  }
  (this->m_elements).m_size = N;
  return;
}

Assistant:

void cbtUnionFind::allocate(int N)
{
	m_elements.resize(N);
}